

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O3

void rapidjson::internal::Grisu2(double value,char *buffer,int *length,int *K)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  DiyFp DVar4;
  DiyFp DVar5;
  DiyFp w_p;
  DiyFp w_m;
  DiyFp v;
  DiyFp local_90;
  DiyFp local_80;
  DiyFp local_70;
  DiyFp local_60;
  DiyFp local_50;
  DiyFp local_40;
  
  uVar2 = (uint)((ulong)value >> 0x34) & 0x7ff;
  local_60.f = ((ulong)value & 0xfffffffffffff) + 0x10000000000000;
  if (uVar2 == 0) {
    local_60.f = (ulong)value & 0xfffffffffffff;
  }
  local_60.e = -0x432;
  if (uVar2 != 0) {
    local_60.e = uVar2 - 0x433;
  }
  local_70.f = 0;
  local_70.e = 0;
  local_80.f = 0;
  local_80.e = 0;
  DiyFp::NormalizedBoundaries(&local_60,&local_70,&local_80);
  dVar1 = (double)(-0x3d - local_80.e) * 0.30102999566398114 + 347.0;
  iVar3 = (int)((uint)((double)(int)dVar1 < dVar1) + (int)dVar1) >> 3;
  uVar2 = iVar3 + 1;
  *K = 0x15c - (iVar3 * 8 + 8);
  if (uVar2 < 0x57) {
    local_40.f = *(uint64_t *)
                  (GetCachedPowerByIndex(unsigned_long)::kCachedPowers_F + (ulong)uVar2 * 8);
    local_40.e = (int)*(short *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_E +
                                (ulong)uVar2 * 2);
    DVar4 = DiyFp::Normalize(&local_60);
    local_90.f = DVar4.f;
    local_90.e = DVar4.e;
    DVar4 = DiyFp::operator*(&local_90,&local_40);
    local_50.f = DVar4.f;
    local_50.e = DVar4.e;
    DVar4 = DiyFp::operator*(&local_80,&local_40);
    local_90.e = DVar4.e;
    DVar5 = DiyFp::operator*(&local_70,&local_40);
    local_90.f = DVar4.f - 1;
    DigitGen(&local_50,&local_90,(DVar4.f + ~DVar5.f) - 1,buffer,length,K);
    return;
  }
  __assert_fail("index < 87",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/internal/diyfp.h"
                ,0xdc,"DiyFp rapidjson::internal::GetCachedPowerByIndex(size_t)");
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
    const DiyFp v(value);
    DiyFp w_m, w_p;
    v.NormalizedBoundaries(&w_m, &w_p);

    const DiyFp c_mk = GetCachedPower(w_p.e, K);
    const DiyFp W = v.Normalize() * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}